

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bov.hpp
# Opt level: O2

void __thiscall
diy::io::BOV::set_shape<std::vector<int,std::allocator<int>>>
          (BOV *this,vector<int,_std::allocator<int>_> *shape)

{
  pointer piVar1;
  pointer puVar2;
  uint uVar3;
  unsigned_long local_30;
  
  piVar1 = (this->shape_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->shape_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->shape_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  puVar2 = (this->stride_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->stride_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->stride_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  uVar3 = 0;
  while( true ) {
    piVar1 = (shape->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if ((ulong)((long)(shape->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= (ulong)uVar3) break;
    std::vector<int,_std::allocator<int>_>::push_back(&this->shape_,piVar1 + uVar3);
    local_30 = 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&this->stride_,&local_30);
    uVar3 = uVar3 + 1;
  }
  puVar2 = (this->stride_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  *puVar2 = (long)(this->shape_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[1] * puVar2[1];
  return;
}

Assistant:

void          set_shape(const S& shape)
      {
        shape_.clear();
        stride_.clear();
        for (unsigned i = 0; i < shape.size(); ++i)
        {
            shape_.push_back(shape[i]);
            stride_.push_back(1);
        }
        for (auto i = shape_.size() - 2; i ==  0; --i)
          stride_[i] = stride_[i+1] * shape_[i+1];
        stride_[0] = stride_[1] * shape_[1];
      }